

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::Coroutine<kj::HttpInputStream::Response>::fulfill
          (Coroutine<kj::HttpInputStream::Response> *this,
          FixVoid<kj::HttpInputStream::Response> *value)

{
  bool bVar1;
  Response *value_00;
  ExceptionOr<kj::HttpInputStream::Response> local_1e8;
  Response *local_18;
  FixVoid<kj::HttpInputStream::Response> *value_local;
  Coroutine<kj::HttpInputStream::Response> *this_local;
  
  local_18 = value;
  value_local = (FixVoid<kj::HttpInputStream::Response> *)this;
  bVar1 = CoroutineBase::isWaiting(&this->super_CoroutineBase);
  if (bVar1) {
    value_00 = mv<kj::HttpInputStream::Response>(local_18);
    ExceptionOr<kj::HttpInputStream::Response>::ExceptionOr(&local_1e8,value_00);
    ExceptionOr<kj::HttpInputStream::Response>::operator=(&this->result,&local_1e8);
    ExceptionOr<kj::HttpInputStream::Response>::~ExceptionOr(&local_1e8);
    CoroutineBase::scheduleResumption(&this->super_CoroutineBase);
  }
  return;
}

Assistant:

void fulfill(FixVoid<T>&& value) {
    // Called by the return_value()/return_void() functions in our mixin class.

    if (isWaiting()) {
      result = kj::mv(value);
      scheduleResumption();
    }
  }